

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O1

void __thiscall ON_SerialNumberMap::Internal_HashTableInvalidate(ON_SerialNumberMap *this)

{
  if (this->m_bHashTableIsValid != '\0') {
    this->m_bHashTableIsValid = '\0';
  }
  return;
}

Assistant:

void ON_SerialNumberMap::Internal_HashTableInvalidate()
{
  // This helper function is called when the memory
  // locations of SN_ELEMENTs are going to change.
  // and the pointers saved in m_hash_table[] and
  // SN_ELEMENT::next may become invalid. When a
  // valid m_hash_table[] is needed at a later time,
  // BuildHashTableHelper() will restore it.
  if ( m_bHashTableIsValid )
  {
    m_bHashTableIsValid = false;
  }
}